

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O3

void __thiscall trun::Process::Process(Process *this,string *use_command)

{
  (this->super_ProcessCallbackBase).super_ProcessCallbackInterface._vptr_ProcessCallbackInterface =
       (_func_int **)&PTR_OnProcessStarted_0021ec58;
  (this->command)._M_dataplus._M_p = (pointer)&(this->command).field_2;
  (this->command)._M_string_length = 0;
  (this->command).field_2._M_local_buf[0] = '\0';
  (this->arguments).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->arguments;
  (this->arguments).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->arguments;
  (this->arguments).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  Process_Unix::Process_Unix(&this->process);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->command,use_command);
  this->callback = (ProcessCallbackInterface *)0x0;
  return;
}

Assistant:

Process::Process(std::string use_command) {
	command = use_command;
	callback = nullptr;
}